

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void duckdb::FlatVector::SetNull(Vector *vector,idx_t idx,bool is_null)

{
  ulong *puVar1;
  PhysicalType PVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer puVar4;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar9;
  type vector_00;
  Vector *vector_01;
  idx_t iVar10;
  undefined7 in_register_00000011;
  idx_t idx_in_entry;
  idx_t idx_00;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *entry;
  pointer this_00;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  idx_t local_28;
  
  puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((int)CONCAT71(in_register_00000011,is_null) == 0) {
    if (puVar3 != (unsigned_long *)0x0) {
      puVar3[idx >> 6] = puVar3[idx >> 6] | 1L << ((byte)idx & 0x3f);
    }
  }
  else {
    if (puVar3 == (unsigned_long *)0x0) {
      local_28 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_38,&local_28);
      p_Var7 = p_Stack_30;
      peVar6 = local_38;
      local_38 = (element_type *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar6;
      (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var7;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data);
      (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar5 = (byte)idx & 0x3f;
    puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
             (idx >> 6);
    *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
  }
  if (is_null) {
    PVar2 = (vector->type).physical_type_;
    if (PVar2 == ARRAY) {
      vector_01 = ArrayVector::GetEntryInternal<duckdb::Vector>(vector);
      iVar10 = ArrayType::GetSize(&vector->type);
      if (iVar10 != 0) {
        idx_00 = idx * iVar10;
        do {
          SetNull(vector_01,idx_00,true);
          idx_00 = idx_00 + 1;
          iVar10 = iVar10 - 1;
        } while (iVar10 != 0);
      }
    }
    else if (PVar2 == STRUCT) {
      pvVar9 = StructVector::GetEntries(vector);
      puVar4 = (pvVar9->
               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (pvVar9->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar4;
          this_00 = this_00 + 1) {
        vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_00);
        SetNull(vector_00,idx,true);
      }
    }
  }
  return;
}

Assistant:

void FlatVector::SetNull(Vector &vector, idx_t idx, bool is_null) {
	D_ASSERT(vector.GetVectorType() == VectorType::FLAT_VECTOR);
	vector.validity.Set(idx, !is_null);
	if (!is_null) {
		return;
	}

	auto &type = vector.GetType();
	auto internal_type = type.InternalType();

	// Set all child entries to NULL.
	if (internal_type == PhysicalType::STRUCT) {
		auto &entries = StructVector::GetEntries(vector);
		for (auto &entry : entries) {
			FlatVector::SetNull(*entry, idx, is_null);
		}
		return;
	}

	// Set all child entries to NULL.
	if (internal_type == PhysicalType::ARRAY) {
		auto &child = ArrayVector::GetEntry(vector);
		auto array_size = ArrayType::GetSize(type);
		auto child_offset = idx * array_size;
		for (idx_t i = 0; i < array_size; i++) {
			FlatVector::SetNull(child, child_offset + i, is_null);
		}
	}
}